

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcodes_llvm_builtins.cpp
# Opt level: O1

Id dxil_spv::emit_boolean_convert_instruction<LLVMBC::ConstantExpr>
             (Impl *impl,ConstantExpr *instruction,bool is_signed)

{
  bool bVar1;
  TypeID TVar2;
  uint uVar3;
  Id IVar4;
  Id IVar5;
  Id arg;
  Builder *this;
  Type *pTVar6;
  Operation *this_00;
  Constant *value;
  float f;
  double d;
  Id local_40;
  Id local_3c;
  initializer_list<unsigned_int> local_38;
  
  this = Converter::Impl::builder(impl);
  pTVar6 = LLVMBC::Value::getType((Value *)instruction);
  TVar2 = LLVMBC::Type::getTypeID(pTVar6);
  IVar4 = 0;
  switch(TVar2) {
  case HalfTyID:
    bVar1 = Converter::Impl::support_native_fp16_operations(impl);
    if (!bVar1) goto switchD_00159a5c_caseD_3;
    IVar4 = spv::Builder::makeFloat16Constant(this,0,false);
    IVar5 = spv::Builder::makeFloat16Constant(this,(ushort)is_signed << 0xf | 0x3c00,false);
    break;
  case FloatTyID:
switchD_00159a5c_caseD_3:
    IVar4 = spv::Builder::makeFloatConstant(this,0.0,false);
    if (is_signed) {
      f = -1.0;
    }
    else {
      f = 1.0;
    }
    IVar5 = spv::Builder::makeFloatConstant(this,f,false);
    break;
  case DoubleTyID:
    IVar4 = spv::Builder::makeDoubleConstant(this,0.0,false);
    if (is_signed) {
      d = -1.0;
    }
    else {
      d = 1.0;
    }
    IVar5 = spv::Builder::makeDoubleConstant(this,d,false);
    break;
  case IntegerTyID:
    pTVar6 = LLVMBC::Value::getType((Value *)instruction);
    uVar3 = LLVMBC::Type::getIntegerBitWidth(pTVar6);
    if ((0x3f < uVar3 - 1) || ((0x8000000080008081U >> ((ulong)(uVar3 - 1) & 0x3f) & 1) == 0)) {
      uVar3 = (uint)(0x20 < uVar3) * 0x20 + 0x20;
    }
    if (uVar3 == 0x40) {
      IVar4 = spv::Builder::makeIntegerType(this,0x40,false);
      IVar4 = spv::Builder::makeInt64Constant(this,IVar4,0,false);
      IVar5 = spv::Builder::makeIntegerType(this,0x40,false);
      IVar5 = spv::Builder::makeInt64Constant(this,IVar5,-(ulong)is_signed | 1,false);
    }
    else {
      if (uVar3 == 0x20) {
        IVar4 = spv::Builder::makeIntegerType(this,0x20,false);
        IVar4 = spv::Builder::makeIntConstant(this,IVar4,0,false);
        IVar5 = spv::Builder::makeIntegerType(this,0x20,false);
        uVar3 = -(uint)is_signed | 1;
      }
      else {
        if (uVar3 != 0x10) {
          return 0;
        }
        IVar4 = spv::Builder::makeIntegerType(this,0x10,false);
        IVar4 = spv::Builder::makeIntConstant(this,IVar4,0,false);
        IVar5 = spv::Builder::makeIntegerType(this,0x10,false);
        uVar3 = 1;
        if (is_signed) {
          uVar3 = 0xffff;
        }
      }
      IVar5 = spv::Builder::makeIntConstant(this,IVar5,uVar3,false);
    }
    break;
  default:
    goto switchD_00159a5c_default;
  }
  this_00 = Converter::Impl::allocate(impl,OpSelect,(Value *)instruction);
  value = LLVMBC::ConstantExpr::getOperand(instruction,0);
  arg = Converter::Impl::get_id_for_value(impl,&value->super_Value,0);
  Operation::add_id(this_00,arg);
  local_38._M_array = &local_40;
  local_38._M_len = 2;
  local_40 = IVar5;
  local_3c = IVar4;
  Operation::add_ids(this_00,&local_38);
  Converter::Impl::add(impl,this_00,false);
  pTVar6 = LLVMBC::Value::getType((Value *)instruction);
  Converter::Impl::decorate_relaxed_precision(impl,pTVar6,this_00->id,false);
  IVar4 = this_00->id;
switchD_00159a5c_default:
  return IVar4;
}

Assistant:

static spv::Id emit_boolean_convert_instruction(Converter::Impl &impl, const InstructionType *instruction, bool is_signed)
{
	auto &builder = impl.builder();
	spv::Id const_0;
	spv::Id const_1;

	switch (instruction->getType()->getTypeID())
	{
	case llvm::Type::TypeID::HalfTyID:
		if (impl.support_native_fp16_operations())
		{
			const_0 = builder.makeFloat16Constant(0);
			const_1 = builder.makeFloat16Constant(0x3c00u | (is_signed ? 0x8000u : 0u));
		}
		else
		{
			const_0 = builder.makeFloatConstant(0.0f);
			const_1 = builder.makeFloatConstant(is_signed ? -1.0f : 1.0f);
		}
		break;

	case llvm::Type::TypeID::FloatTyID:
		const_0 = builder.makeFloatConstant(0.0f);
		const_1 = builder.makeFloatConstant(is_signed ? -1.0f : 1.0f);
		break;

	case llvm::Type::TypeID::DoubleTyID:
		const_0 = builder.makeDoubleConstant(0.0);
		const_1 = builder.makeDoubleConstant(is_signed ? -1.0 : 1.0);
		break;

	case llvm::Type::TypeID::IntegerTyID:
		switch (physical_integer_bit_width(instruction->getType()->getIntegerBitWidth()))
		{
		case 16:
			const_0 = builder.makeUint16Constant(0);
			const_1 = builder.makeUint16Constant(is_signed ? 0xffff : 1u);
			break;

		case 32:
			const_0 = builder.makeUintConstant(0);
			const_1 = builder.makeUintConstant(is_signed ? 0xffffffffu : 1u);
			break;

		case 64:
			const_0 = builder.makeUint64Constant(0ull);
			const_1 = builder.makeUint64Constant(is_signed ? ~0ull : 1ull);
			break;

		default:
			return 0;
		}
		break;

	default:
		return 0;
	}

	Operation *op = impl.allocate(spv::OpSelect, instruction);
	op->add_id(impl.get_id_for_value(instruction->getOperand(0)));
	op->add_ids({ const_1, const_0 });
	impl.add(op);
	impl.decorate_relaxed_precision(instruction->getType(), op->id, false);
	return op->id;
}